

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Ptr_t *
Acb_TransformPatchFunctions(Vec_Ptr_t *vSops,Vec_Wec_t *vSupps,Vec_Int_t **pvUsed,int nDivs)

{
  uint uVar1;
  int Entry;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Int_t *p;
  int *piVar5;
  Vec_Int_t *vMap;
  int *__ptr;
  void *__s;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong local_70;
  
  uVar1 = vSops->nSize;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  local_70 = 8;
  if (6 < uVar1 - 1) {
    local_70 = (ulong)uVar1;
  }
  pVVar3->nSize = 0;
  iVar11 = (int)local_70;
  pVVar3->nCap = iVar11;
  if (iVar11 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar11 << 3);
  }
  pVVar3->pArray = ppvVar4;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar5 = (int *)malloc(400);
  p->pArray = piVar5;
  vMap = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < nDivs - 1U) {
    iVar11 = nDivs;
  }
  vMap->nCap = iVar11;
  if (iVar11 == 0) {
    vMap->pArray = (int *)0x0;
    vMap->nSize = nDivs;
    __ptr = (int *)malloc(0x10);
    piVar5 = (int *)0x0;
    *__ptr = 0;
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[1] = nDivs;
  }
  else {
    piVar5 = (int *)malloc((long)iVar11 << 2);
    vMap->pArray = piVar5;
    vMap->nSize = nDivs;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0xff,(long)nDivs * 4);
    }
    __ptr = (int *)malloc(0x10);
    *__ptr = iVar11;
    __s = malloc((long)iVar11 << 2);
    *(void **)(__ptr + 2) = __s;
    __ptr[1] = nDivs;
    if (__s != (void *)0x0) {
      memset(__s,0,(long)nDivs << 2);
    }
  }
  if (vSupps->nSize < 1) {
LAB_0039ca46:
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
    }
    free(__ptr);
    if (vMap->pArray != (int *)0x0) {
      free(vMap->pArray);
    }
    free(vMap);
    *pvUsed = p;
    return pVVar3;
  }
  lVar13 = 0;
  do {
    if (vSops->nSize <= lVar13) {
LAB_0039cad9:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pVVar2 = vSupps->pArray;
    pcVar8 = (char *)vSops->pArray[lVar13];
    if (pcVar8 == (char *)0x0) {
      pcVar7 = (char *)0x0;
      pcVar8 = pcVar7;
    }
    else {
      sVar6 = strlen(pcVar8);
      pcVar7 = (char *)malloc(sVar6 + 1);
      strcpy(pcVar7,pcVar8);
      pcVar8 = pcVar7;
    }
LAB_0039c843:
    pcVar7 = strtok(pcVar7,"\n");
    if (pcVar7 != (char *)0x0) {
      lVar9 = 0;
      do {
        if (pcVar7[lVar9] != '-') {
          if (pcVar7[lVar9] == ' ') goto LAB_0039c897;
          if (pVVar2[lVar13].nSize <= lVar9) goto LAB_0039caba;
          iVar11 = pVVar2[lVar13].pArray[lVar9];
          if (((long)iVar11 < 0) || (__ptr[1] <= iVar11)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)(*(long *)(__ptr + 2) + (long)iVar11 * 4) = 1;
        }
        lVar9 = lVar9 + 1;
      } while( true );
    }
    if (pcVar8 != (char *)0x0) {
      free(pcVar8);
    }
    lVar13 = lVar13 + 1;
    uVar10 = (ulong)vSupps->nSize;
    if ((long)uVar10 <= lVar13) {
      if (0 < vSupps->nSize) {
        lVar13 = 0;
        do {
          pVVar2 = vSupps->pArray;
          iVar11 = pVVar2[lVar13].nSize;
          if (0 < iVar11) {
            lVar9 = 0;
            do {
              Entry = pVVar2[lVar13].pArray[lVar9];
              lVar12 = (long)Entry;
              if ((lVar12 < 0) || (__ptr[1] <= Entry)) {
LAB_0039caba:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              if (*(int *)(*(long *)(__ptr + 2) + lVar12 * 4) != 0) {
                if (nDivs <= Entry) goto LAB_0039caba;
                if (piVar5[lVar12] < 0) {
                  piVar5[lVar12] = p->nSize;
                  Vec_IntPush(p,Entry);
                  iVar11 = pVVar2[lVar13].nSize;
                }
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < iVar11);
            uVar10 = (ulong)(uint)vSupps->nSize;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < (int)uVar10);
        if ((int)uVar10 < 1) goto LAB_0039ca46;
        lVar9 = 0;
        lVar13 = 0;
        while (lVar13 < vSops->nSize) {
          pcVar8 = Acb_RemapOneFunction
                             ((char *)vSops->pArray[lVar13],
                              (Vec_Int_t *)((long)&vSupps->pArray->nCap + lVar9),vMap,p->nSize);
          iVar11 = (int)local_70;
          if ((int)lVar13 == iVar11) {
            if (iVar11 < 0x10) {
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
              }
              pVVar3->pArray = ppvVar4;
              pVVar3->nCap = 0x10;
              local_70 = 0x10;
            }
            else {
              local_70 = (ulong)(uint)(iVar11 * 2);
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(local_70 * 8);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar3->pArray,local_70 * 8);
              }
              pVVar3->pArray = ppvVar4;
              pVVar3->nCap = iVar11 * 2;
            }
          }
          else {
            ppvVar4 = pVVar3->pArray;
          }
          lVar12 = lVar13 + 1;
          pVVar3->nSize = (int)lVar12;
          ppvVar4[lVar13] = pcVar8;
          lVar9 = lVar9 + 0x10;
          lVar13 = lVar12;
          if (vSupps->nSize <= lVar12) goto LAB_0039ca46;
        }
        goto LAB_0039cad9;
      }
      goto LAB_0039ca46;
    }
  } while( true );
LAB_0039c897:
  pcVar7 = (char *)0x0;
  goto LAB_0039c843;
}

Assistant:

Vec_Ptr_t * Acb_TransformPatchFunctions( Vec_Ptr_t * vSops, Vec_Wec_t * vSupps, Vec_Int_t ** pvUsed, int nDivs )
{
    Vec_Ptr_t * vFuncs = Vec_PtrAlloc( Vec_PtrSize(vSops) );
    Vec_Int_t * vUsed = Vec_IntAlloc( 100 ); 
    Vec_Int_t * vMap = Vec_IntStartFull( nDivs );
    Vec_Int_t * vPres = Vec_IntStart( nDivs );
    Vec_Int_t * vLevel;
    int i, k, iVar;
    // check what divisors are used
    Vec_WecForEachLevel( vSupps, vLevel, i )
    {
        char * pSop = (char *)Vec_PtrEntry( vSops, i );
        char * pStrCopy = Abc_UtilStrsav( pSop );
        char * pToken = strtok( pStrCopy, "\n" ); 
        while ( pToken != NULL )
        {
            for ( k = 0; pToken[k] != ' '; k++ )
                if ( pToken[k] != '-' )
                    Vec_IntWriteEntry( vPres, Vec_IntEntry(vLevel, k), 1 );
            pToken = strtok( NULL, "\n" );
        }
        ABC_FREE( pStrCopy );
    }
    // create common order
    Vec_WecForEachLevel( vSupps, vLevel, i )
        Vec_IntForEachEntry( vLevel, iVar, k )
        {
            if ( !Vec_IntEntry(vPres, iVar) )
                continue;
            if ( Vec_IntEntry(vMap, iVar) >= 0 )
                continue;
            Vec_IntWriteEntry( vMap, iVar, Vec_IntSize(vUsed) );
            Vec_IntPush( vUsed, iVar );
        }
    //printf( "The number of used variables %d (out of %d).\n", Vec_IntSum(vPres), Vec_IntSize(vPres) );
    // remap SOPs
    Vec_WecForEachLevel( vSupps, vLevel, i )
    {
        char * pSop = (char *)Vec_PtrEntry( vSops, i );
        pSop = Acb_RemapOneFunction( pSop, vLevel, vMap, Vec_IntSize(vUsed) );
        //printf( "Function %d\n%s", i, pSop );
        Vec_PtrPush( vFuncs, pSop );
    }
    Vec_IntFree( vPres );
    Vec_IntFree( vMap );
    *pvUsed = vUsed;
    return vFuncs;
}